

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  uchar *src;
  byte bVar1;
  int iVar2;
  int iVar3;
  mbedtls_md_info_t *pmVar4;
  size_t sVar5;
  ulong slen;
  uchar *dst;
  uchar *puVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  uchar *puVar10;
  bool bVar11;
  uchar zeros [8];
  uchar result [64];
  uchar buf [1024];
  mbedtls_md_context_t local_498;
  uchar local_480 [70];
  uchar auStack_43a [2];
  byte local_438 [1032];
  
  if ((mode == 1) && (ctx->padding != 1)) {
    return -0x4080;
  }
  sVar7 = ctx->len;
  if (0xfffffffffffffc0e < sVar7 - 0x401) {
    if (mode == 0) {
      iVar2 = mbedtls_rsa_public(ctx,sig,auStack_43a + 2);
    }
    else {
      iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,auStack_43a + 2);
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    if (auStack_43a[sVar7 + 1] != 0xbc) {
      return -0x4100;
    }
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar4 = mbedtls_md_info_from_type(md_alg);
      if (pmVar4 == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      bVar1 = mbedtls_md_get_size(pmVar4);
      hashlen = (uint)bVar1;
    }
    pmVar4 = mbedtls_md_info_from_type(mgf1_hash_id);
    if (pmVar4 != (mbedtls_md_info_t *)0x0) {
      bVar1 = mbedtls_md_get_size(pmVar4);
      local_480[0] = '\0';
      local_480[1] = '\0';
      local_480[2] = '\0';
      local_480[3] = '\0';
      local_480[4] = '\0';
      local_480[5] = '\0';
      local_480[6] = '\0';
      local_480[7] = '\0';
      sVar5 = mbedtls_mpi_bitlen(&ctx->N);
      if (local_438[0] >> ((char)sVar5 + (char)sVar7 * -8 + 7U & 0x1f) == 0) {
        slen = (ulong)bVar1;
        bVar11 = (sVar5 - 1 & 7) == 0;
        uVar8 = sVar7 - 1;
        if (!bVar11) {
          uVar8 = sVar7;
        }
        if (uVar8 < slen + 2) {
          return -0x4080;
        }
        mbedtls_md_init(&local_498);
        iVar2 = mbedtls_md_setup(&local_498,pmVar4,0);
        if (iVar2 == 0) {
          dst = auStack_43a + (ulong)bVar11 + 2;
          src = dst + (uVar8 - slen) + -1;
          iVar2 = mgf_mask(dst,~slen + uVar8,src,slen,&local_498);
          if (iVar2 == 0) {
            local_438[0] = local_438[0] &
                           (byte)(0xff >> ((char)uVar8 * '\b' - (char)(sVar5 - 1) & 0x1fU));
            puVar10 = dst + (uVar8 - slen) + -2;
            puVar6 = dst;
            if (dst < puVar10) {
              lVar9 = (uVar8 - slen) + -2;
              do {
                puVar6 = dst;
                if (*dst != '\0') break;
                dst = dst + 1;
                lVar9 = lVar9 + -1;
                puVar6 = puVar10;
              } while (lVar9 != 0);
            }
            iVar2 = -0x4100;
            if (*puVar6 == '\x01') {
              sVar7 = (long)src - (long)(puVar6 + 1);
              if ((((expected_salt_len == -1) || (sVar7 == (long)expected_salt_len)) &&
                  (iVar2 = mbedtls_md_starts(&local_498), iVar2 == 0)) &&
                 (((iVar2 = mbedtls_md_update(&local_498,local_480,8), iVar2 == 0 &&
                   (iVar2 = mbedtls_md_update(&local_498,hash,(ulong)hashlen), iVar2 == 0)) &&
                  ((iVar2 = mbedtls_md_update(&local_498,puVar6 + 1,sVar7), iVar2 == 0 &&
                   (iVar2 = mbedtls_md_finish(&local_498,local_480 + 8), iVar2 == 0)))))) {
                iVar3 = bcmp(src,local_480 + 8,slen);
                iVar2 = -0x4380;
                if (iVar3 == 0) {
                  iVar2 = 0;
                }
              }
            }
          }
        }
        mbedtls_md_free(&local_498);
        return iVar2;
      }
    }
  }
  return -0x4080;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t siglen;
    unsigned char *p;
    unsigned char *hash_start;
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t observed_salt_len, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( sig != NULL );
    RSA_VALIDATE_RET( ( md_alg  == MBEDTLS_MD_NONE &&
                        hashlen == 0 ) ||
                      hash != NULL );

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    memset( zeros, 0, 8 );

    /*
     * Note: EMSA-PSS verification is over the length of N - 1 bits
     */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }

    if( siglen < hlen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    hash_start = p + siglen - hlen - 1;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    ret = mgf_mask( p, siglen - hlen - 1, hash_start, hlen, &md_ctx );
    if( ret != 0 )
        goto exit;

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < hash_start - 1 && *p == 0 )
        p++;

    if( *p++ != 0x01 )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto exit;
    }

    observed_salt_len = hash_start - p;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        observed_salt_len != (size_t) expected_salt_len )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto exit;
    }

    /*
     * Generate H = Hash( M' )
     */
    ret = mbedtls_md_starts( &md_ctx );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, zeros, 8 );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, hash, hashlen );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, p, observed_salt_len );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_finish( &md_ctx, result );
    if ( ret != 0 )
        goto exit;

    if( memcmp( hash_start, result, hlen ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto exit;
    }

exit:
    mbedtls_md_free( &md_ctx );

    return( ret );
}